

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_kernel_pack8to1_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  int i;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Allocator *pAVar21;
  ulong uVar22;
  Allocator *pAVar23;
  int j;
  Allocator *pAVar24;
  long lVar25;
  ulong uVar26;
  undefined8 *puVar27;
  int k;
  long lVar28;
  Allocator *pAVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [32];
  float fVar45;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float tmp [8] [3];
  Mat local_f8;
  ulong local_a8;
  long local_a0;
  float fStack_98;
  undefined8 auStack_94 [3];
  undefined1 auStack_78 [72];
  
  uVar31 = (ulong)(uint)outch;
  local_f8.cstep = 0;
  local_f8.data = (Allocator *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elempack = 0;
  local_f8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_f8.elemsize._4_4_ = (int)local_f8.refcount;
  local_f8.allocator = (Allocator *)local_f8.data;
  local_f8.dims = (int)local_f8.refcount;
  local_f8.w = local_f8.refcount._4_4_;
  local_f8.c = local_f8.elempack;
  Mat::create(&local_f8,0x40,inch,outch,4,(Allocator *)0x0);
  auVar15 = _DAT_0054fe80;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar26 = 0;
    pAVar23 = (Allocator *)local_f8.data;
    do {
      if (0 < inch) {
        iVar16 = inch * 9 * (int)uVar26;
        uVar32 = 0;
        pAVar24 = pAVar23;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar16 * 4 + 0x20);
          lVar33 = 0;
          do {
            auVar36 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00550000 + lVar33)),
                                    ZEXT416(*(uint *)((long)&DAT_0055000c + lVar33)),0x10);
            auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)((long)&DAT_00550018 + lVar33)),0x20);
            auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)((long)&DAT_00550024 + lVar33)),0x30);
            auVar51 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00550004 + lVar33)),
                                    ZEXT416(*(uint *)((long)&DAT_00550010 + lVar33)),0x10);
            auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)((long)&DAT_0055001c + lVar33)),0x20);
            auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)((long)&DAT_00550028 + lVar33)),0x30);
            fVar35 = auVar36._0_4_;
            fVar37 = auVar36._4_4_;
            fVar38 = auVar36._8_4_;
            fVar39 = auVar36._12_4_;
            fVar40 = auVar51._0_4_;
            fVar42 = auVar51._4_4_;
            fVar43 = auVar51._8_4_;
            fVar44 = auVar51._12_4_;
            auVar36 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00550008 + lVar33)),
                                    ZEXT416(*(uint *)((long)&DAT_00550010 + lVar33 + 4)),0x10);
            auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)((long)&DAT_00550020 + lVar33)),0x20);
            auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)((long)&DAT_0055002c + lVar33)),0x30);
            fVar45 = auVar36._0_4_;
            fVar48 = auVar36._4_4_;
            fVar49 = auVar36._8_4_;
            fVar50 = auVar36._12_4_;
            auVar51._0_4_ = fVar40 * fVar2 + fVar35 * fVar1 + fVar45 * fVar3;
            auVar51._4_4_ = fVar42 * fVar2 + fVar37 * fVar1 + fVar48 * fVar3;
            auVar51._8_4_ = fVar43 * fVar2 + fVar38 * fVar1 + fVar49 * fVar3;
            auVar51._12_4_ = fVar44 * fVar2 + fVar39 * fVar1 + fVar50 * fVar3;
            auVar52._0_4_ = fVar40 * fVar5 + fVar35 * fVar4 + fVar45 * fVar6;
            auVar52._4_4_ = fVar42 * fVar5 + fVar37 * fVar4 + fVar48 * fVar6;
            auVar52._8_4_ = fVar43 * fVar5 + fVar38 * fVar4 + fVar49 * fVar6;
            auVar52._12_4_ = fVar44 * fVar5 + fVar39 * fVar4 + fVar50 * fVar6;
            auVar36._0_8_ =
                 CONCAT44(fVar8 * fVar42 + fVar37 * fVar7 + fVar9 * fVar48,
                          fVar8 * fVar40 + fVar35 * fVar7 + fVar9 * fVar45);
            auVar36._8_4_ = fVar8 * fVar43 + fVar38 * fVar7 + fVar9 * fVar49;
            auVar36._12_4_ = fVar8 * fVar44 + fVar39 * fVar7 + fVar9 * fVar50;
            auVar41._16_16_ = auVar52;
            auVar41._0_16_ = auVar51;
            auVar47 = vpermilps_avx(auVar41,auVar15);
            auVar46._16_16_ = auVar51;
            auVar46._0_16_ = auVar52;
            auVar41 = vmovsldup_avx(auVar46);
            auVar41 = vblendps_avx(auVar47,auVar41,0x42);
            auVar47._8_8_ = auVar36._0_8_;
            auVar47._0_8_ = auVar36._0_8_;
            auVar47._16_16_ = auVar36;
            auVar41 = vblendps_avx(auVar41,auVar47,0x24);
            auVar51 = vshufps_avx(auVar51,auVar52,0xff);
            auVar36 = vshufpd_avx(auVar36,auVar36,3);
            auVar36 = vblendps_avx(auVar36,auVar51,6);
            *(undefined1 (*) [16])(auStack_78 + lVar33) = auVar36;
            *(undefined1 (*) [32])((long)auStack_94 + lVar33 + -4) = auVar41;
            lVar33 = lVar33 + 0x30;
          } while (lVar33 != 0x60);
          lVar33 = 0;
          pAVar29 = pAVar24;
          do {
            fVar1 = *(float *)((long)auStack_94 + lVar33 * 0xc + -4);
            uVar10 = *(undefined8 *)((long)auStack_94 + lVar33 * 0xc);
            puVar27 = (undefined8 *)&DAT_00550004;
            lVar18 = 0;
            do {
              auVar34._0_4_ = (float)*puVar27 * (float)uVar10;
              auVar34._4_4_ = (float)((ulong)*puVar27 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar34._8_8_ = 0;
              auVar36 = vmovshdup_avx(auVar34);
              *(float *)((long)&pAVar29->_vptr_Allocator + lVar18 * 4) =
                   auVar34._0_4_ + fVar1 * *(float *)((long)puVar27 + -4) + auVar36._0_4_;
              lVar18 = lVar18 + 1;
              puVar27 = (undefined8 *)((long)puVar27 + 0xc);
            } while (lVar18 != 8);
            lVar33 = lVar33 + 1;
            pAVar29 = pAVar29 + 4;
          } while (lVar33 != 8);
          uVar32 = uVar32 + 1;
          pAVar24 = (Allocator *)
                    ((long)&pAVar24->_vptr_Allocator +
                    (long)local_f8.w *
                    CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
        } while (uVar32 != (uint)inch);
      }
      uVar26 = uVar26 + 1;
      pAVar23 = (Allocator *)
                ((long)&pAVar23->_vptr_Allocator +
                local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
    } while (uVar26 != uVar31);
  }
  uVar17 = outch + 7;
  if (-1 < outch) {
    uVar17 = outch;
  }
  local_a8 = uVar31;
  Mat::create(kernel_tm_pack8,inch,0x40,(((int)uVar17 >> 3) - (uVar17 & 0xfffffff8)) + outch,0x20,8,
              (Allocator *)0x0);
  uVar26 = 0;
  if (7 < outch) {
    iVar16 = kernel_tm_pack8->w;
    pvVar11 = kernel_tm_pack8->data;
    sVar12 = kernel_tm_pack8->elemsize;
    local_a0 = kernel_tm_pack8->cstep * sVar12;
    uVar32 = 0;
    do {
      lVar18 = local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      lVar33 = (long)local_f8.w * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      pAVar23 = (Allocator *)((long)(_func_int ***)local_f8.data + lVar18 * uVar32);
      lVar28 = 0;
      do {
        if (7 < inch) {
          lVar19 = (long)pvVar11 + (long)iVar16 * sVar12 * lVar28 + (uVar32 >> 3) * local_a0;
          pAVar24 = pAVar23;
          lVar30 = 0;
          do {
            lVar25 = 0;
            pAVar29 = pAVar24;
            do {
              lVar20 = lVar19;
              lVar19 = 0;
              pAVar21 = pAVar29;
              do {
                *(undefined4 *)(lVar20 + lVar19) = *(undefined4 *)&pAVar21->_vptr_Allocator;
                pAVar21 = (Allocator *)((long)&pAVar21->_vptr_Allocator + lVar18);
                lVar19 = lVar19 + 4;
              } while (lVar19 != 0x20);
              lVar25 = lVar25 + 1;
              pAVar29 = (Allocator *)((long)&pAVar29->_vptr_Allocator + lVar33);
              lVar19 = lVar20 + 0x20;
            } while (lVar25 != 8);
            lVar25 = lVar30 + 0xf;
            pAVar24 = pAVar24 + lVar33;
            lVar19 = lVar20 + 0x20;
            lVar30 = lVar30 + 8;
          } while (lVar25 < inch);
        }
        lVar28 = lVar28 + 1;
        pAVar23 = (Allocator *)((long)&pAVar23->_vptr_Allocator + 4);
      } while (lVar28 != 0x40);
      uVar26 = uVar32 + 8;
      uVar22 = uVar32 + 0xf;
      uVar32 = uVar26;
    } while (uVar22 < uVar31);
    outch = (int)local_a8;
  }
  if ((int)uVar26 < outch) {
    iVar16 = kernel_tm_pack8->w;
    pvVar11 = kernel_tm_pack8->data;
    sVar12 = kernel_tm_pack8->elemsize;
    sVar13 = kernel_tm_pack8->cstep;
    uVar26 = uVar26 & 0xffffffff;
    lVar18 = local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
    pAVar23 = (Allocator *)((long)(_func_int ***)local_f8.data + lVar18 * uVar26);
    lVar33 = (long)local_f8.w * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
    do {
      lVar28 = 0;
      pAVar24 = pAVar23;
      do {
        if (7 < inch) {
          lVar30 = (long)pvVar11 +
                   (long)iVar16 * sVar12 * lVar28 +
                   (ulong)(((uint)uVar26 & 7) + ((uint)(uVar26 >> 3) & 0x1fffffff)) *
                   sVar13 * sVar12;
          lVar19 = 0;
          pAVar29 = pAVar24;
          do {
            lVar25 = 0;
            pAVar21 = pAVar29;
            do {
              *(undefined4 *)(lVar30 + lVar25) = *(undefined4 *)&pAVar21->_vptr_Allocator;
              pAVar21 = (Allocator *)((long)&pAVar21->_vptr_Allocator + lVar33);
              lVar25 = lVar25 + 4;
            } while (lVar25 != 0x20);
            lVar25 = lVar19 + 0xf;
            pAVar29 = pAVar29 + lVar33;
            lVar30 = lVar30 + 0x20;
            lVar19 = lVar19 + 8;
          } while (lVar25 < inch);
        }
        lVar28 = lVar28 + 1;
        pAVar24 = (Allocator *)((long)&pAVar24->_vptr_Allocator + 4);
      } while (lVar28 != 0x40);
      uVar26 = uVar26 + 1;
      pAVar23 = (Allocator *)((long)&pAVar23->_vptr_Allocator + lVar18);
    } while (uVar26 != uVar31);
  }
  piVar14 = (int *)CONCAT44(local_f8.refcount._4_4_,(int)local_f8.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_f8.data != (Allocator *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack8to1_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = 8a-inch/8a-64-outch;
    kernel_tm_pack8.create(8 * inch / 8, 64, outch / 8 + outch % 8, (size_t)4u * 8, 8);

    int p = 0;
    for (; p + 7 < outch; p += 8)
    {
        Mat g0 = kernel_tm_pack8.channel(p / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel_tm.channel(p + j).row(q + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack8.channel(p / 8 + p % 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    const float* k00 = k0.row(q + i);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}